

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesStatesFixedScaling
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  double *pdVar10;
  
  uVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  iVar3 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
  iVar6 = startPattern * 4;
  for (uVar8 = 0; uVar8 != (~((int)uVar2 >> 0x1f) & uVar2); uVar8 = uVar8 + 1) {
    iVar9 = uVar8 * 0x14;
    pdVar10 = destP + (long)iVar6 + 3;
    for (lVar7 = (long)startPattern; lVar7 < endPattern; lVar7 = lVar7 + 1) {
      iVar4 = states1[lVar7];
      iVar5 = states2[lVar7];
      dVar1 = scaleFactors[lVar7];
      pdVar10[-3] = (matrices1[iVar4 + iVar9] * matrices2[iVar5 + iVar9]) / dVar1;
      pdVar10[-2] = (matrices1[iVar4 + iVar9 + 5] * matrices2[iVar5 + iVar9 + 5]) / dVar1;
      pdVar10[-1] = (matrices1[iVar4 + iVar9 + 10] * matrices2[iVar5 + iVar9 + 10]) / dVar1;
      *pdVar10 = (matrices1[iVar4 + iVar9 + 0xf] * matrices2[iVar5 + iVar9 + 0xf]) / dVar1;
      pdVar10 = pdVar10 + 4;
    }
    iVar6 = iVar6 + iVar3 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesStatesFixedScaling(REALTYPE* destP,
                                                                           const int* states1,
                                                                           const REALTYPE* matrices1,
                                                                           const int* states2,
                                                                           const REALTYPE* matrices2,
                                                                           const REALTYPE* scaleFactors,
                                                                           int startPattern,
                                                                           int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          v += 4*startPattern;
        }

        int w = l*4*OFFSET;

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];
            const int state2 = states2[k];
            const REALTYPE scaleFactor = scaleFactors[k];

            destP[v    ] = matrices1[w            + state1] *
                           matrices2[w            + state2] / scaleFactor;
            destP[v + 1] = matrices1[w + OFFSET*1 + state1] *
                           matrices2[w + OFFSET*1 + state2] / scaleFactor;
            destP[v + 2] = matrices1[w + OFFSET*2 + state1] *
                           matrices2[w + OFFSET*2 + state2] / scaleFactor;
            destP[v + 3] = matrices1[w + OFFSET*3 + state1] *
                           matrices2[w + OFFSET*3 + state2] / scaleFactor;
            v += 4;
        }
    }
}